

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O2

int nn_xrespondent_send(nn_sockbase *self,nn_msg *msg)

{
  FILE *__stream;
  uint32_t key;
  uint uVar1;
  size_t sVar2;
  uint8_t *buf;
  nn_hash_item *pnVar3;
  char *pcVar4;
  
  sVar2 = nn_chunkref_size(&msg->sphdr);
  if (3 < sVar2) {
    buf = (uint8_t *)nn_chunkref_data(&msg->sphdr);
    key = nn_getl(buf);
    nn_chunkref_trim(&msg->sphdr,4);
    pnVar3 = nn_hash_get((nn_hash *)&self[1].sock,key);
    if ((pnVar3 != (nn_hash_item *)0x0) &&
       (pnVar3 = nn_hash_get((nn_hash *)&self[1].sock,key), ((ulong)pnVar3[2].list.next & 1) != 0))
    {
      uVar1 = nn_pipe_send((nn_pipe *)pnVar3[-1].list.prev,msg);
      __stream = _stderr;
      if ((int)uVar1 < 0) {
        pcVar4 = nn_err_strerror(-uVar1);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)-uVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/xrespondent.c"
                ,0xb8);
        fflush(_stderr);
        nn_err_abort();
      }
      if ((uVar1 & 1) == 0) {
        return 0;
      }
      *(byte *)&pnVar3[2].list.next = *(byte *)&pnVar3[2].list.next & 0xfe;
      return 0;
    }
  }
  nn_msg_term(msg);
  return 0;
}

Assistant:

int nn_xrespondent_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    uint32_t key;
    struct nn_xrespondent *xrespondent;
    struct nn_xrespondent_data *data;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    /*  We treat invalid peer ID as if the peer was non-existent. */
    if (nn_slow (nn_chunkref_size (&msg->sphdr) < sizeof (uint32_t))) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Retrieve destination peer ID. Trim it from the header. */
    key = nn_getl (nn_chunkref_data (&msg->sphdr));
    nn_chunkref_trim (&msg->sphdr, 4);

    /*  Find the appropriate pipe to send the message to. If there's none,
        or if it's not ready for sending, silently drop the message. */
    data = nn_cont (nn_hash_get (&xrespondent->outpipes, key),
        struct nn_xrespondent_data, outitem);
    if (!data || !(data->flags & NN_XRESPONDENT_OUT)) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Send the message. */
    rc = nn_pipe_send (data->pipe, msg);
    errnum_assert (rc >= 0, -rc);
    if (rc & NN_PIPE_RELEASE)
        data->flags &= ~NN_XRESPONDENT_OUT;

    return 0;
}